

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

ConstantLegal kratos::Const::is_legal(int64_t value,uint32_t width,bool is_signed)

{
  byte bVar1;
  ulong local_50;
  uint64_t unsigned_value;
  uint64_t max_1;
  int64_t max;
  int64_t min;
  uint64_t temp;
  bool is_signed_local;
  uint32_t width_local;
  int64_t value_local;
  
  bVar1 = (byte)width;
  if (is_signed) {
    if (value < -1L << (bVar1 - 1 & 0x3f)) {
      return Small;
    }
    if ((1L << (bVar1 - 1 & 0x3f)) + -1 < value) {
      return Big;
    }
  }
  else {
    if (width == 0x40) {
      local_50 = std::numeric_limits<unsigned_long>::max();
    }
    else {
      local_50 = (1L << (bVar1 & 0x3f)) - 1;
    }
    if (local_50 < (ulong)value) {
      return Big;
    }
  }
  return Legal;
}

Assistant:

Const::ConstantLegal Const::is_legal(int64_t value, uint32_t width, bool is_signed) {
    if (is_signed) {
        // compute the -max value
        uint64_t temp = (~0ull) << (width - 1);
        int64_t min = 0;
        std::memcpy(&min, &temp, sizeof(min));
        if (value < min) return Const::ConstantLegal::Small;
        temp = (1ull << (width - 1)) - 1;
        int64_t max;
        std::memcpy(&max, &temp, sizeof(max));
        if (value > max) return Const::ConstantLegal::Big;
    } else {
        uint64_t max = width == 64 ? std::numeric_limits<uint64_t>::max() : (1ull << width) - 1;
        uint64_t unsigned_value;
        std::memcpy(&unsigned_value, &value, sizeof(unsigned_value));
        if (unsigned_value > max) return Const::ConstantLegal::Big;
    }
    return Const::ConstantLegal::Legal;
}